

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_nuniformfv(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  ContextType ctxType;
  GLint location;
  GLuint program_00;
  GLuint program_01;
  NotSupportedError *this;
  allocator<char> local_24a;
  allocator<char> local_249;
  GLfloat params [4];
  GLsizei bufferSize;
  ProgramSources local_200;
  string local_130;
  string local_110;
  ShaderProgram program;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    renderCtx = ctx->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
               ,&local_24a);
    getVtxFragVersionSources((string *)params,&local_110,ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
               ,&local_249);
    getVtxFragVersionSources((string *)&bufferSize,&local_130,ctx);
    glu::makeVtxFragSources(&local_200,(string *)params,(string *)&bufferSize);
    glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_200);
    glu::ProgramSources::~ProgramSources(&local_200);
    std::__cxx11::string::~string((string *)&bufferSize);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)params);
    std::__cxx11::string::~string((string *)&local_110);
    location = glu::CallLogWrapper::glGetUniformLocation
                         (&ctx->super_CallLogWrapper,program.m_program.m_program,"vUnif_vec4");
    params[0] = 0.0;
    params[1] = 0.0;
    params[2] = 0.0;
    params[3] = 0.0;
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    if (location == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"Failed to retrieve uniform location",&local_24a);
      NegativeTestContext::fail(ctx,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
    }
    program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
    program_01 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
    glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8a2e,&bufferSize);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
               &local_24a);
    NegativeTestContext::beginSection(ctx,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    glu::CallLogWrapper::glGetnUniformfv
              (&ctx->super_CallLogWrapper,0xffffffff,location,bufferSize,params);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "GL_INVALID_OPERATION is generated if program is not a program object.",&local_24a);
    NegativeTestContext::beginSection(ctx,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    glu::CallLogWrapper::glGetnUniformfv
              (&ctx->super_CallLogWrapper,program_00,location,bufferSize,params);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "GL_INVALID_OPERATION is generated if program has not been successfully linked.",
               &local_24a);
    NegativeTestContext::beginSection(ctx,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    glu::CallLogWrapper::glGetnUniformfv
              (&ctx->super_CallLogWrapper,program_01,location,bufferSize,params);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object."
               ,&local_24a);
    NegativeTestContext::beginSection(ctx,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    glu::CallLogWrapper::glGetnUniformfv
              (&ctx->super_CallLogWrapper,program.m_program.m_program,-1,bufferSize,params);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "GL_INVALID_OPERATION is generated if the buffer size required to store the requested data is greater than bufSize."
               ,&local_24a);
    NegativeTestContext::beginSection(ctx,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    glu::CallLogWrapper::glGetnUniformfv
              (&ctx->super_CallLogWrapper,program.m_program.m_program,location,0,params);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_01);
    glu::ShaderProgram::~ShaderProgram(&program);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x228);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void get_nuniformfv (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				unif			= ctx.glGetUniformLocation(program.getProgram(), "vUnif_vec4");
	GLfloat				params[4]		= { 0.0f, 0.0f, 0.0f, 0.0f };
	GLuint				shader;
	GLuint				programEmpty;
	GLsizei				bufferSize;

	ctx.glUseProgram(program.getProgram());

	if (unif == -1)
		ctx.fail("Failed to retrieve uniform location");

	shader			= ctx.glCreateShader(GL_VERTEX_SHADER);
	programEmpty	= ctx.glCreateProgram();

	ctx.glGetIntegerv(GL_MAX_COMBINED_UNIFORM_BLOCKS, &bufferSize);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetnUniformfv(-1, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetnUniformfv(shader, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetnUniformfv(programEmpty, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object.");
	ctx.glGetnUniformfv(program.getProgram(), -1, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the buffer size required to store the requested data is greater than bufSize.");
	ctx.glGetnUniformfv(program.getProgram(), unif, 0, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(programEmpty);
}